

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::addLogger(SimpleLoggerMgr *this,SimpleLogger *logger)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_28;
  SimpleLogger *local_18;
  
  local_18 = logger;
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->loggersLock);
  std::__detail::
  _Insert_base<SimpleLogger_*,_SimpleLogger_*,_std::allocator<SimpleLogger_*>,_std::__detail::_Identity,_std::equal_to<SimpleLogger_*>,_std::hash<SimpleLogger_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<SimpleLogger_*,_SimpleLogger_*,_std::allocator<SimpleLogger_*>,_std::__detail::_Identity,_std::equal_to<SimpleLogger_*>,_std::hash<SimpleLogger_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->loggers,&local_18);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void SimpleLoggerMgr::addLogger(SimpleLogger* logger) {
    std::unique_lock<std::mutex> l(loggersLock);
    loggers.insert(logger);
}